

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O3

void isaac_init(isaacctx *ctx,int flag)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t uVar14;
  
  ctx->c = 0;
  ctx->a = 0;
  ctx->b = 0;
  if (flag == 0) {
    uVar6 = 0x95d90059;
    uVar5 = 0xc3163e4b;
    uVar3 = 0xf421ad8;
    uVar1 = 0xd92a4a78;
    uVar12 = 0xa51a3c49;
    uVar10 = 0xc4efea1b;
    uVar2 = 0x30609119;
    uVar14 = 0x1367df5a;
    uVar13 = 0xfffffffffffffff8;
    do {
      uVar7 = uVar6 << 0xb ^ uVar14;
      iVar4 = uVar3 + uVar7;
      uVar8 = uVar5 >> 2 ^ uVar5 + uVar6;
      uVar1 = uVar1 + uVar8;
      uVar5 = iVar4 * 0x100 ^ iVar4 + uVar5;
      iVar11 = uVar12 + uVar5;
      uVar3 = uVar1 >> 0x10 ^ iVar4 + uVar1;
      uVar10 = uVar10 + uVar3;
      uVar1 = iVar11 * 0x400 ^ iVar11 + uVar1;
      iVar4 = uVar2 + uVar1;
      uVar12 = uVar10 >> 4 ^ iVar11 + uVar10;
      uVar7 = uVar7 + uVar12;
      uVar10 = iVar4 * 0x100 ^ iVar4 + uVar10;
      uVar6 = uVar8 + uVar10;
      uVar14 = uVar6 + uVar7;
      uVar2 = uVar7 >> 9 ^ iVar4 + uVar7;
      uVar5 = uVar5 + uVar2;
      ctx->mem[uVar13 + 8] = uVar14;
      ctx->mem[uVar13 + 9] = uVar6;
      ctx->mem[uVar13 + 10] = uVar5;
      ctx->mem[uVar13 + 0xb] = uVar3;
      ctx->mem[uVar13 + 0xc] = uVar1;
      ctx->mem[uVar13 + 0xd] = uVar12;
      ctx->mem[uVar13 + 0xe] = uVar10;
      ctx->mem[uVar13 + 0xf] = uVar2;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0xf8);
  }
  else {
    uVar6 = 0x95d90059;
    uVar9 = 0xc3163e4b;
    uVar12 = 0xf421ad8;
    uVar1 = 0xd92a4a78;
    uVar2 = 0xa51a3c49;
    uVar3 = 0xc4efea1b;
    uVar10 = 0x30609119;
    uVar14 = 0x1367df5a;
    uVar13 = 0xfffffffffffffff8;
    do {
      iVar4 = uVar6 + ctx->rsl[uVar13 + 9];
      uVar7 = uVar9 + ctx->rsl[uVar13 + 10];
      uVar5 = iVar4 * 0x800 ^ uVar14 + ctx->rsl[uVar13 + 8];
      iVar11 = uVar12 + ctx->rsl[uVar13 + 0xb] + uVar5;
      uVar8 = uVar7 >> 2 ^ uVar7 + iVar4;
      uVar1 = uVar1 + ctx->rsl[uVar13 + 0xc] + uVar8;
      uVar7 = iVar11 * 0x100 ^ iVar11 + uVar7;
      iVar4 = uVar2 + ctx->rsl[uVar13 + 0xd] + uVar7;
      uVar12 = uVar1 >> 0x10 ^ uVar1 + iVar11;
      uVar3 = uVar3 + ctx->rsl[uVar13 + 0xe] + uVar12;
      uVar1 = iVar4 * 0x400 ^ iVar4 + uVar1;
      iVar11 = uVar10 + ctx->rsl[uVar13 + 0xf] + uVar1;
      uVar2 = uVar3 >> 4 ^ uVar3 + iVar4;
      uVar5 = uVar5 + uVar2;
      uVar3 = iVar11 * 0x100 ^ iVar11 + uVar3;
      uVar6 = uVar8 + uVar3;
      uVar14 = uVar6 + uVar5;
      uVar10 = uVar5 >> 9 ^ uVar5 + iVar11;
      uVar9 = uVar7 + uVar10;
      ctx->mem[uVar13 + 8] = uVar14;
      ctx->mem[uVar13 + 9] = uVar6;
      ctx->mem[uVar13 + 10] = uVar9;
      ctx->mem[uVar13 + 0xb] = uVar12;
      ctx->mem[uVar13 + 0xc] = uVar1;
      ctx->mem[uVar13 + 0xd] = uVar2;
      ctx->mem[uVar13 + 0xe] = uVar3;
      ctx->mem[uVar13 + 0xf] = uVar10;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0xf8);
    uVar13 = 0xfffffffffffffff8;
    do {
      iVar4 = uVar6 + ctx->mem[uVar13 + 9];
      uVar7 = uVar9 + ctx->mem[uVar13 + 10];
      uVar5 = iVar4 * 0x800 ^ uVar14 + ctx->mem[uVar13 + 8];
      iVar11 = uVar12 + ctx->mem[uVar13 + 0xb] + uVar5;
      uVar8 = uVar7 >> 2 ^ uVar7 + iVar4;
      uVar1 = uVar1 + ctx->mem[uVar13 + 0xc] + uVar8;
      uVar7 = iVar11 * 0x100 ^ iVar11 + uVar7;
      iVar4 = uVar2 + ctx->mem[uVar13 + 0xd] + uVar7;
      uVar12 = uVar1 >> 0x10 ^ uVar1 + iVar11;
      uVar3 = uVar3 + ctx->mem[uVar13 + 0xe] + uVar12;
      uVar1 = iVar4 * 0x400 ^ iVar4 + uVar1;
      iVar11 = uVar10 + ctx->mem[uVar13 + 0xf] + uVar1;
      uVar2 = uVar3 >> 4 ^ uVar3 + iVar4;
      uVar5 = uVar5 + uVar2;
      uVar3 = iVar11 * 0x100 ^ iVar11 + uVar3;
      uVar6 = uVar8 + uVar3;
      uVar14 = uVar6 + uVar5;
      uVar10 = uVar5 >> 9 ^ uVar5 + iVar11;
      uVar9 = uVar7 + uVar10;
      ctx->mem[uVar13 + 8] = uVar14;
      ctx->mem[uVar13 + 9] = uVar6;
      ctx->mem[uVar13 + 10] = uVar9;
      ctx->mem[uVar13 + 0xb] = uVar12;
      ctx->mem[uVar13 + 0xc] = uVar1;
      ctx->mem[uVar13 + 0xd] = uVar2;
      ctx->mem[uVar13 + 0xe] = uVar3;
      ctx->mem[uVar13 + 0xf] = uVar10;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0xf8);
  }
  isaac_gen_group(ctx);
  ctx->cnt = 0x100;
  return;
}

Assistant:

void isaac_init(isaacctx *ctx, int flag)
{
    int i;
    uint32_t a;
    uint32_t b;
    uint32_t c;
    uint32_t d;
    uint32_t e;
    uint32_t f;
    uint32_t g;
    uint32_t h;
    uint32_t *m;
    uint32_t *r;

    ctx->a = ctx->b = ctx->c = 0;
    m = ctx->mem;
    r = ctx->rsl;
    a = b = c = d = e = f = g = h = 0x9e3779b9;         /* the golden ratio */

    /* scramble the initial settings */
    for (i = 0 ; i < 4 ; ++i)
    {
        isaac_mix(a, b, c, d, e, f, g, h);
    }

    if (flag) 
    {
        /* initialize using the contents of ctx->rsl[] as the seed */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += r[i];   b += r[i+1]; c += r[i+2]; d += r[i+3];
            e += r[i+4]; f += r[i+5]; g += r[i+6]; h += r[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }

        /* do a second pass to make all of the seed affect all of m */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += m[i];   b += m[i+1]; c += m[i+2]; d += m[i+3];
            e += m[i+4]; f += m[i+5]; g += m[i+6]; h += m[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }
    else
    {
        /* initialize using fixed initial settings */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a; m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }

    /* fill in the first set of results */
    isaac_gen_group(ctx);

    /* prepare to use the first set of results */    
    ctx->cnt = ISAAC_RANDSIZ;
}